

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_get_format(coda_type *type,coda_format *format)

{
  coda_format *format_local;
  coda_type *type_local;
  
  if (type == (coda_type *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0xb16);
    type_local._4_4_ = -1;
  }
  else if (format == (coda_format *)0x0) {
    coda_set_error(-100,"format argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0xb1b);
    type_local._4_4_ = -1;
  }
  else {
    *format = type->format;
    type_local._4_4_ = 0;
  }
  return type_local._4_4_;
}

Assistant:

LIBCODA_API int coda_type_get_format(const coda_type *type, coda_format *format)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (format == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "format argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *format = type->format;
    return 0;
}